

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httprequestparser.h
# Opt level: O0

bool __thiscall httpparser::HttpRequestParser::isSpecial(HttpRequestParser *this,int c)

{
  int c_local;
  HttpRequestParser *this_local;
  
  switch(c) {
  case 9:
  case 0x20:
  case 0x22:
  case 0x28:
  case 0x29:
  case 0x2c:
  case 0x2f:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x7b:
  case 0x7d:
    this_local._7_1_ = true;
    break;
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool isSpecial(int c)
    {
        switch (c)
        {
        case '(': case ')': case '<': case '>': case '@':
        case ',': case ';': case ':': case '\\': case '"':
        case '/': case '[': case ']': case '?': case '=':
        case '{': case '}': case ' ': case '\t':
            return true;
        default:
            return false;
        }
    }